

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O2

void vkt::pipeline::anon_unknown_0::SampledImage::initPrograms
               (SourceCollections *programCollection,CaseDef *caseDef)

{
  int iVar1;
  bool isUint;
  bool isSint;
  uint numComponents;
  char *pcVar2;
  ostream *poVar3;
  ProgramSources *pPVar4;
  TextureFormat TVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  int i;
  uint uVar9;
  ulong uVar10;
  allocator<char> local_2c1;
  CaseDef *local_2c0;
  SourceCollections *local_2b8;
  undefined1 local_2b0 [40];
  string refClearColor;
  string texelFormatStr;
  string refPrimitiveColor;
  string local_228;
  string local_208;
  string samplerTypeStr;
  ostringstream src;
  CaseDef local_44;
  
  CaseDef::CaseDef(&local_44,caseDef);
  addSimpleVertexAndFragmentPrograms(programCollection,&local_44);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar3 = std::operator<<((ostream *)&src,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in  vec4  in_position;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"out gl_PerVertex {\n");
  poVar3 = std::operator<<(poVar3,"    vec4 gl_Position;\n");
  poVar3 = std::operator<<(poVar3,"};\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    gl_Position = in_position;\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&texelFormatStr,"sample_vert",(allocator<char> *)&refPrimitiveColor);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&texelFormatStr);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_2b0,&refClearColor);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_2b0);
  std::__cxx11::string::~string((string *)(local_2b0 + 8));
  std::__cxx11::string::~string((string *)&refClearColor);
  std::__cxx11::string::~string((string *)&texelFormatStr);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  TVar5 = ::vk::mapVkFormat(caseDef->colorFormat);
  numComponents = tcu::getNumUsedChannels(TVar5.order);
  isUint = ::vk::isUintFormat(caseDef->colorFormat);
  isSint = ::vk::isIntFormat(caseDef->colorFormat);
  pcVar2 = "vec4";
  if (isSint) {
    pcVar2 = "ivec4";
  }
  pcVar8 = "uvec4";
  if (!isUint) {
    pcVar8 = pcVar2;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&texelFormatStr,pcVar8,(allocator<char> *)&src);
  local_2b0._0_16_ = (undefined1  [16])getClearValue(caseDef->colorFormat);
  if (isUint) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    local_2c0 = caseDef;
    local_2b8 = programCollection;
    poVar3 = std::operator<<((ostream *)&src,"u");
    std::operator<<(poVar3,"vec4(");
    uVar10 = 0;
    uVar7 = (ulong)numComponents;
    if ((int)numComponents < 1) {
      uVar7 = uVar10;
    }
    for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&src);
      pcVar2 = "";
      if (uVar10 < 3) {
        pcVar2 = ", ";
      }
      std::operator<<(poVar3,pcVar2);
    }
    for (uVar9 = numComponents; (int)uVar9 < 4; uVar9 = uVar9 + 1) {
      poVar3 = (ostream *)std::ostream::operator<<(&src,(uint)(uVar9 == 3));
      pcVar2 = ", ";
      if (uVar9 == 3) {
        pcVar2 = "";
      }
      std::operator<<(poVar3,pcVar2);
    }
    std::operator<<((ostream *)&src,")");
    std::__cxx11::stringbuf::str();
  }
  else {
    if (!isSint) {
      getColorStr<float>(&refClearColor,(float *)local_2b0,numComponents,false,false);
      goto LAB_004fc737;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    local_2c0 = caseDef;
    local_2b8 = programCollection;
    poVar3 = std::operator<<((ostream *)&src,"i");
    std::operator<<(poVar3,"vec4(");
    uVar10 = 0;
    uVar7 = (ulong)numComponents;
    if ((int)numComponents < 1) {
      uVar7 = uVar10;
    }
    for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      poVar3 = (ostream *)std::ostream::operator<<(&src,*(int *)(local_2b0 + uVar10 * 4));
      pcVar2 = "";
      if (uVar10 < 3) {
        pcVar2 = ", ";
      }
      std::operator<<(poVar3,pcVar2);
    }
    for (uVar9 = numComponents; (int)uVar9 < 4; uVar9 = uVar9 + 1) {
      poVar3 = (ostream *)std::ostream::operator<<(&src,(uint)(uVar9 == 3));
      pcVar2 = ", ";
      if (uVar9 == 3) {
        pcVar2 = "";
      }
      std::operator<<(poVar3,pcVar2);
    }
    std::operator<<((ostream *)&src,")");
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  caseDef = local_2c0;
  programCollection = local_2b8;
LAB_004fc737:
  _src = 0x3f800000;
  getColorStr<float>(&refPrimitiveColor,(float *)&src,numComponents,isUint,isSint);
  iVar1 = caseDef->numLayers;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = "i";
  pcVar8 = "";
  if (!isSint) {
    pcVar2 = "";
  }
  pcVar6 = "u";
  if (!isUint) {
    pcVar6 = pcVar2;
  }
  poVar3 = std::operator<<((ostream *)&src,pcVar6);
  poVar3 = std::operator<<(poVar3,"sampler2DMS");
  if (1 < iVar1) {
    pcVar8 = "Array";
  }
  std::operator<<(poVar3,pcVar8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar3 = std::operator<<((ostream *)&src,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out int o_status;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(set = 0, binding = 0) uniform ");
  poVar3 = std::operator<<(poVar3,(string *)&samplerTypeStr);
  poVar3 = std::operator<<(poVar3," colorTexture;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    int checksum = 0;\n");
  std::operator<<(poVar3,"\n");
  if (caseDef->numLayers == 1) {
    poVar3 = std::operator<<((ostream *)&src,"    for (int sampleNdx = 0; sampleNdx < ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,caseDef->numSamples);
    poVar3 = std::operator<<(poVar3,"; ++sampleNdx) {\n");
    poVar3 = std::operator<<(poVar3,"        ");
    poVar3 = std::operator<<(poVar3,(string *)&texelFormatStr);
    pcVar2 = " color = texelFetch(colorTexture, ivec2(gl_FragCoord.xy), sampleNdx);\n";
  }
  else {
    poVar3 = std::operator<<((ostream *)&src,"    for (int layerNdx = 0; layerNdx < ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,caseDef->numLayers);
    poVar3 = std::operator<<(poVar3,"; ++layerNdx)\n");
    poVar3 = std::operator<<(poVar3,"    for (int sampleNdx = 0; sampleNdx < ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,caseDef->numSamples);
    poVar3 = std::operator<<(poVar3,"; ++sampleNdx) {\n");
    poVar3 = std::operator<<(poVar3,"        ");
    poVar3 = std::operator<<(poVar3,(string *)&texelFormatStr);
    pcVar2 = " color = texelFetch(colorTexture, ivec3(gl_FragCoord.xy, layerNdx), sampleNdx);\n";
  }
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3,"        if (color == ");
  poVar3 = std::operator<<(poVar3,(string *)&refClearColor);
  poVar3 = std::operator<<(poVar3," || color == ");
  poVar3 = std::operator<<(poVar3,(string *)&refPrimitiveColor);
  poVar3 = std::operator<<(poVar3,")\n");
  poVar3 = std::operator<<(poVar3,"            ++checksum;\n");
  std::operator<<(poVar3,"    }\n");
  poVar3 = std::operator<<((ostream *)&src,"\n");
  poVar3 = std::operator<<(poVar3,"    o_status = checksum;\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"sample_frag",&local_2c1);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_208);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_2b0,&local_228);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_2b0);
  std::__cxx11::string::~string((string *)(local_2b0 + 8));
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::string::~string((string *)&samplerTypeStr);
  std::__cxx11::string::~string((string *)&refPrimitiveColor);
  std::__cxx11::string::~string((string *)&refClearColor);
  std::__cxx11::string::~string((string *)&texelFormatStr);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const CaseDef caseDef)
{
	// Pass 1: Render to texture

	addSimpleVertexAndFragmentPrograms(programCollection, caseDef);

	// Pass 2: Sample texture

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4  in_position;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    gl_Position = in_position;\n"
			<< "}\n";

		programCollection.glslSources.add("sample_vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		const int			numComponents		= tcu::getNumUsedChannels(mapVkFormat(caseDef.colorFormat).order);
		const bool			isUint				= isUintFormat(caseDef.colorFormat);
		const bool			isSint				= isIntFormat(caseDef.colorFormat);
		const std::string	texelFormatStr		= (isUint ? "uvec4" : isSint ? "ivec4" : "vec4");
		const std::string	refClearColor		= getReferenceClearColorStr(caseDef.colorFormat, numComponents, isUint, isSint);
		const std::string	refPrimitiveColor	= getReferencePrimitiveColorStr(numComponents, isUint, isSint);
		const std::string	samplerTypeStr		= getSamplerTypeStr(caseDef.numLayers, isUint, isSint);

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) out int o_status;\n"
			<< "\n"
			<< "layout(set = 0, binding = 0) uniform " << samplerTypeStr << " colorTexture;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    int checksum = 0;\n"
			<< "\n";

		if (caseDef.numLayers == 1)
			src << "    for (int sampleNdx = 0; sampleNdx < " << caseDef.numSamples << "; ++sampleNdx) {\n"
				<< "        " << texelFormatStr << " color = texelFetch(colorTexture, ivec2(gl_FragCoord.xy), sampleNdx);\n"
				<< "        if (color == " << refClearColor << " || color == " << refPrimitiveColor << ")\n"
				<< "            ++checksum;\n"
				<< "    }\n";
		else
			src << "    for (int layerNdx = 0; layerNdx < " << caseDef.numLayers << "; ++layerNdx)\n"
				<< "    for (int sampleNdx = 0; sampleNdx < " << caseDef.numSamples << "; ++sampleNdx) {\n"
				<< "        " << texelFormatStr << " color = texelFetch(colorTexture, ivec3(gl_FragCoord.xy, layerNdx), sampleNdx);\n"
				<< "        if (color == " << refClearColor << " || color == " << refPrimitiveColor << ")\n"
				<< "            ++checksum;\n"
				<< "    }\n";

		src << "\n"
			<< "    o_status = checksum;\n"
			<< "}\n";

		programCollection.glslSources.add("sample_frag") << glu::FragmentSource(src.str());
	}
}